

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O2

int Aig_BaseSize(Aig_Man_t *p,Aig_Obj_t *pObj,int nLutSize)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  
  pObj_00 = (Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  iVar1 = Aig_ObjIsConst1(pObj_00);
  iVar2 = 0;
  if (iVar1 == 0) {
    iVar2 = Aig_ObjLevel(pObj_00);
    if (iVar2 < nLutSize) {
      iVar1 = Aig_SupportSize(p,pObj_00);
      iVar2 = 1;
      if (iVar1 < nLutSize) {
        iVar2 = iVar1;
      }
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int Aig_BaseSize( Aig_Man_t * p, Aig_Obj_t * pObj, int nLutSize )
{
    int nBaseSize;
    pObj = Aig_Regular(pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return 0;
    if ( Aig_ObjLevel(pObj) >= nLutSize )
        return 1;
    nBaseSize = Aig_SupportSize( p, pObj );
    if ( nBaseSize >= nLutSize )
        return 1;
    return nBaseSize;
}